

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O0

double __thiscall
icu_63::DayPeriodRules::getMidPointForDayPeriod
          (DayPeriodRules *this,DayPeriod dayPeriod,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  DayPeriodRules *local_38;
  double midPoint;
  int32_t endHour;
  int32_t startHour;
  UErrorCode *errorCode_local;
  DayPeriod dayPeriod_local;
  DayPeriodRules *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    iVar2 = getStartHourForDayPeriod(this,dayPeriod,errorCode);
    iVar3 = getEndHourForDayPeriod(this,dayPeriod,errorCode);
    UVar1 = ::U_FAILURE(*errorCode);
    if (UVar1 == '\0') {
      local_38 = (DayPeriodRules *)((double)(iVar2 + iVar3) / 2.0);
      if ((iVar3 < iVar2) &&
         (local_38 = (DayPeriodRules *)((double)local_38 + 12.0), 24.0 <= (double)local_38)) {
        local_38 = (DayPeriodRules *)((double)local_38 - 24.0);
      }
      this_local = local_38;
    }
    else {
      this_local = (DayPeriodRules *)0xbff0000000000000;
    }
  }
  else {
    this_local = (DayPeriodRules *)0xbff0000000000000;
  }
  return (double)this_local;
}

Assistant:

double DayPeriodRules::getMidPointForDayPeriod(
        DayPeriodRules::DayPeriod dayPeriod, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) { return -1; }

    int32_t startHour = getStartHourForDayPeriod(dayPeriod, errorCode);
    int32_t endHour = getEndHourForDayPeriod(dayPeriod, errorCode);
    // Can't obtain startHour or endHour; bail out.
    if (U_FAILURE(errorCode)) { return -1; }

    double midPoint = (startHour + endHour) / 2.0;

    if (startHour > endHour) {
        // dayPeriod wraps around midnight. Shift midPoint by 12 hours, in the direction that
        // lands it in [0, 24).
        midPoint += 12;
        if (midPoint >= 24) {
            midPoint -= 24;
        }
    }

    return midPoint;
}